

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Export * __thiscall wasm::Module::getExport(Module *this,Name name)

{
  mapped_type pEVar1;
  mapped_type *ppEVar2;
  string *in_R8;
  Name name_00;
  string local_50 [39];
  allocator<char> local_29;
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getExport",&local_29);
  name_00.super_IString.str._M_str = (char *)local_50;
  ppEVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
                      ((wasm *)&this->exportsMap,name.super_IString.str._M_len,name_00,in_R8);
  pEVar1 = *ppEVar2;
  std::__cxx11::string::~string(local_50);
  return pEVar1;
}

Assistant:

Export* Module::getExport(Name name) {
  return getModuleElement(exportsMap, name, "getExport");
}